

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O1

qualified_column_set_t * __thiscall
duckdb::StarExpression::SerializedQualifiedExcludeList
          (qualified_column_set_t *__return_storage_ptr__,StarExpression *this)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  qualified_column_set_t *in_RAX;
  __hashtable *__h;
  qualified_column_set_t *local_28;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_28 = in_RAX;
  for (p_Var1 = (this->exclude_list)._M_h._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    bVar2 = QualifiedColumnName::IsQualified((QualifiedColumnName *)(p_Var1 + 1));
    if (bVar2) {
      local_28 = __return_storage_ptr__;
      ::std::
      _Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::QualifiedColumnName_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::QualifiedColumnName,true>>>>
                ((_Hashtable<duckdb::QualifiedColumnName,duckdb::QualifiedColumnName,std::allocator<duckdb::QualifiedColumnName>,std::__detail::_Identity,duckdb::QualifiedColumnEquality,duckdb::QualifiedColumnHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)__return_storage_ptr__,(QualifiedColumnName *)(p_Var1 + 1),&local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

qualified_column_set_t StarExpression::SerializedQualifiedExcludeList() const {
	// we serialize only qualified elements in the qualified list for backwards compatibility
	qualified_column_set_t result;
	for (auto &entry : exclude_list) {
		if (entry.IsQualified()) {
			result.insert(entry);
		}
	}
	return result;
}